

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O2

void __thiscall re2c::Warn::condition_order(Warn *this,uint32_t line)

{
  bool error;
  
  if ((this->mask[0] & 1) == 0) {
    return;
  }
  error = (bool)((byte)(this->mask[0] >> 1) & 1);
  this->error_accuml = (bool)(this->error_accuml | error);
  warning(names,line,error,
          "looks like you use hardcoded numbers instead of autogenerated condition names: better add \'/*!types:re2c*/\' directive or \'-t, --type-header\' option and don\'t rely on fixed condition order."
         );
  return;
}

Assistant:

void Warn::condition_order (uint32_t line)
{
	if (mask[CONDITION_ORDER] & WARNING)
	{
		const bool e = mask[CONDITION_ORDER] & ERROR;
		error_accuml |= e;
		warning (names[CONDITION_ORDER], line, e,
			"looks like you use hardcoded numbers instead of autogenerated condition names: "
			"better add '/*!types:re2c*/' directive or '-t, --type-header' option "
			"and don't rely on fixed condition order.");
	}
}